

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::HasOwnProperty
               (Var instance,PropertyId propertyId,ScriptContext *requestContext,
               PropertyString *propString)

{
  Type *type;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  RecyclableObject *obj;
  PolymorphicInlineCache *pPVar7;
  undefined4 *puVar8;
  undefined7 extraout_var;
  uint uVar9;
  undefined1 local_60 [8];
  PropertyDescriptor desc;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar2) {
    return 0;
  }
  obj = UnsafeVarTo<Js::RecyclableObject>(instance);
  bVar2 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar2) {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
    BVar4 = GetOwnPropertyDescriptor(obj,propertyId,requestContext,(PropertyDescriptor *)local_60);
    return BVar4;
  }
  if (propString == (PropertyString *)0x0) goto LAB_00ab4dfb;
  local_60[0] = CacheType_None;
  local_60[1] = SlotType_None;
  local_60[2] = false;
  pPVar7 = PropertyString::GetLdElemInlineCache(propString);
  bVar2 = PolymorphicInlineCache::PretendTryGetProperty
                    (pPVar7,(obj->type).ptr,(PropertyCacheOperationInfo *)local_60);
  if (bVar2) {
    if (local_60[0] == CacheType_Proto) {
      iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xc])(obj,propertyId);
      if (iVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        uVar9 = 0x4a1;
        goto LAB_00ab4d8a;
      }
LAB_00ab4d9b:
      BVar4 = 0;
    }
    else {
      if (local_60[0] != CacheType_Local) goto LAB_00ab4c8b;
      iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xc])(obj,propertyId);
      if (iVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        uVar9 = 0x49e;
LAB_00ab4de0:
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,uVar9,"(object->HasOwnProperty(propertyId))",
                                    "object->HasOwnProperty(propertyId)");
        if (!bVar2) goto LAB_00ab4e28;
        BVar4 = 1;
        goto LAB_00ab4dee;
      }
LAB_00ab4cd5:
      BVar4 = 1;
    }
LAB_00ab4df5:
    bVar2 = false;
  }
  else {
LAB_00ab4c8b:
    pPVar7 = PropertyString::GetStElemInlineCache(propString);
    type = (obj->type).ptr;
    bVar3 = PolymorphicInlineCache::PretendTrySetProperty
                      (pPVar7,type,type,(PropertyCacheOperationInfo *)local_60);
    BVar4 = (BOOL)CONCAT71(extraout_var,bVar3);
    bVar2 = true;
    if (bVar3) {
      if (local_60[0] == CacheType_LocalWithoutProperty) {
        iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xc])(obj,propertyId);
        if (iVar5 == 0) goto LAB_00ab4d9b;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        uVar9 = 0x4b0;
LAB_00ab4d8a:
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,uVar9,"(!object->HasOwnProperty(propertyId))",
                                    "!object->HasOwnProperty(propertyId)");
        if (!bVar2) {
LAB_00ab4e28:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        BVar4 = 0;
LAB_00ab4dee:
        *puVar8 = 0;
        goto LAB_00ab4df5;
      }
      if (local_60[0] == CacheType_Local) {
        iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xc])(obj,propertyId);
        if (iVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          uVar9 = 0x4ad;
          goto LAB_00ab4de0;
        }
        goto LAB_00ab4cd5;
      }
    }
  }
  if (!bVar2) {
    return BVar4;
  }
LAB_00ab4dfb:
  uVar6 = 0;
  if (obj != (RecyclableObject *)0x0) {
    iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xc])(obj,propertyId);
    uVar6 = (uint)(iVar5 != 0);
  }
  return uVar6;
}

Assistant:

BOOL JavascriptOperators::HasOwnProperty(
        Var instance,
        PropertyId propertyId,
        _In_ ScriptContext* requestContext,
        _In_opt_ PropertyString* propString)
    {
        if (TaggedNumber::Is(instance))
        {
            return FALSE;
        }
        RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);

        if (VarIs<JavascriptProxy>(instance))
        {
            PropertyDescriptor desc;
            return GetOwnPropertyDescriptor(object, propertyId, requestContext, &desc);
        }

        // If we have a PropertyString, attempt to shortcut the lookup by using its caches
        if (propString != nullptr)
        {
            PropertyCacheOperationInfo info;
            if (propString->GetLdElemInlineCache()->PretendTryGetProperty(object->GetType(), &info))
            {
                switch (info.cacheType)
                {
                case CacheType_Local:
                    Assert(object->HasOwnProperty(propertyId));
                    return TRUE;
                case CacheType_Proto:
                    Assert(!object->HasOwnProperty(propertyId));
                    return FALSE;
                default:
                    // We had a cache hit, but cache doesn't tell us if we have an own property
                    break;
                }
            }
            if (propString->GetStElemInlineCache()->PretendTrySetProperty(object->GetType(), object->GetType(), &info))
            {
                switch (info.cacheType)
                {
                case CacheType_Local:
                    Assert(object->HasOwnProperty(propertyId));
                    return TRUE;
                case CacheType_LocalWithoutProperty:
                    Assert(!object->HasOwnProperty(propertyId));
                    return FALSE;
                default:
                    // We had a cache hit, but cache doesn't tell us if we have an own property
                    break;
                }
            }
        }

        return object && object->HasOwnProperty(propertyId);
    }